

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *
testing::internal::ActionResultHolder<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>
::
PerformAction<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>(std::__cxx11::string_const&,int,int,int,int,unsigned_int)>
          (Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
           *action,ArgumentTuple *args)

{
  _Invoker_type p_Var1;
  SDL_Window_conflict *pSVar2;
  ActionResultHolder<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *pAVar3;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  undefined8 local_68;
  _Any_data local_60;
  _Manager_type local_50;
  _Invoker_type p_Stack_48;
  SDL_Window_conflict *local_40;
  ArgumentTuple local_38;
  
  pAVar3 = (ActionResultHolder<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *)
           operator_new(0x30);
  local_38.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
  .super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_unsigned_int>.super__Tuple_impl<3UL,_int,_int,_unsigned_int>
  .super__Tuple_impl<4UL,_int,_unsigned_int>.super__Tuple_impl<5UL,_unsigned_int>.
  super__Head_base<5UL,_unsigned_int,_false>._M_head_impl =
       (args->
       super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
       ).super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int>.
       super__Tuple_impl<2UL,_int,_int,_int,_unsigned_int>.
       super__Tuple_impl<3UL,_int,_int,_unsigned_int>.super__Tuple_impl<4UL,_int,_unsigned_int>.
       super__Tuple_impl<5UL,_unsigned_int>.super__Head_base<5UL,_unsigned_int,_false>;
  local_38.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
  .super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_unsigned_int>.super__Tuple_impl<3UL,_int,_int,_unsigned_int>
  .super__Tuple_impl<4UL,_int,_unsigned_int>.super__Head_base<4UL,_int,_false>._M_head_impl =
       (args->
       super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
       ).super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int>.
       super__Tuple_impl<2UL,_int,_int,_int,_unsigned_int>.
       super__Tuple_impl<3UL,_int,_int,_unsigned_int>.super__Tuple_impl<4UL,_int,_unsigned_int>.
       super__Head_base<4UL,_int,_false>._M_head_impl;
  local_38.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
  .super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_unsigned_int>.super__Tuple_impl<3UL,_int,_int,_unsigned_int>
  .super__Head_base<3UL,_int,_false>._M_head_impl =
       (args->
       super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
       ).super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int>.
       super__Tuple_impl<2UL,_int,_int,_int,_unsigned_int>.
       super__Tuple_impl<3UL,_int,_int,_unsigned_int>.super__Head_base<3UL,_int,_false>._M_head_impl
  ;
  local_38.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
  .super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_unsigned_int>.super__Head_base<2UL,_int,_false>._M_head_impl
       = (args->
         super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
         ).super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int>.
         super__Tuple_impl<2UL,_int,_int,_int,_unsigned_int>.super__Head_base<2UL,_int,_false>.
         _M_head_impl;
  local_38.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
  .super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int>.super__Head_base<1UL,_int,_false>.
  _M_head_impl = (args->
                 super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
                 ).super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int>.
                 super__Head_base<1UL,_int,_false>._M_head_impl;
  local_38.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
  .
  super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl =
       (args->
       super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
       ).
       super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
       ._M_head_impl;
  Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::Perform((Result *)&local_60,action,&local_38);
  pSVar2 = local_40;
  p_Var1 = p_Stack_48;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (_Manager_type)0x0;
  p_Stack_70 = p_Stack_48;
  if (local_50 != (_Manager_type)0x0) {
    local_88._M_unused._M_object = local_60._M_unused._M_object;
    local_88._8_8_ = local_60._8_8_;
    local_78 = local_50;
    local_50 = (_Manager_type)0x0;
    p_Stack_48 = (_Invoker_type)0x0;
  }
  local_40 = (SDL_Window_conflict *)0x0;
  (pAVar3->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_0032a4d0;
  *(undefined8 *)
   &(pAVar3->result_).value_._M_t.
    super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
    super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
    super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> = 0;
  *(undefined8 *)
   ((long)&(pAVar3->result_).value_._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_> + 8) = 0;
  *(_Manager_type *)
   ((long)&(pAVar3->result_).value_._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_> + 0x10) = (_Manager_type)0x0;
  *(_Invoker_type *)
   ((long)&(pAVar3->result_).value_._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_> + 0x18) = p_Var1;
  if (local_78 != (_Manager_type)0x0) {
    *(void **)&(pAVar3->result_).value_._M_t.
               super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
               super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
               super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
               super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> =
         local_88._M_unused._M_object;
    *(undefined8 *)
     ((long)&(pAVar3->result_).value_._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_> + 8) = local_88._8_8_;
    *(_Manager_type *)
     ((long)&(pAVar3->result_).value_._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_> + 0x10) = local_78;
    local_78 = (_Manager_type)0x0;
    p_Stack_70 = (_Invoker_type)0x0;
  }
  (pAVar3->result_).value_._M_t.
  super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
  super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
  super__Head_base<0UL,_SDL_Window_*,_false>._M_head_impl = pSVar2;
  local_68 = 0;
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr
            ((unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&local_88);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr
            ((unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&local_60);
  return pAVar3;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }